

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O2

ON_Xform *
ON_Xform::ScaleTransformation
          (ON_Xform *__return_storage_ptr__,ON_3dPoint *fixed_point,double x_scale_factor,
          double y_scale_factor,double z_scale_factor)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  ON_Xform *pOVar4;
  double *pdVar5;
  ON_Xform *pOVar6;
  byte bVar7;
  ON_3dVector delta;
  ON_Xform s;
  ON_Xform t1;
  ON_Xform local_118;
  ON_Xform t0;
  
  bVar7 = 0;
  pdVar3 = (double *)&IdentityTransformation;
  pdVar5 = (double *)&s;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pdVar5 = *pdVar3;
    pdVar3 = pdVar3 + 1;
    pdVar5 = pdVar5 + 1;
  }
  s.m_xform[0][0] = x_scale_factor;
  s.m_xform[1][1] = y_scale_factor;
  s.m_xform[2][2] = z_scale_factor;
  if ((((fixed_point->x != 0.0) || (NAN(fixed_point->x))) || (fixed_point->y != 0.0)) ||
     (((NAN(fixed_point->y) || (fixed_point->z != 0.0)) || (NAN(fixed_point->z))))) {
    ON_3dPoint::operator-(&delta,fixed_point,&ON_3dPoint::Origin);
    ON_3dVector::operator-((ON_3dVector *)&t1,&delta);
    lVar1 = 0x10;
    pOVar4 = &IdentityTransformation;
    pOVar6 = &t0;
    for (lVar2 = lVar1; lVar2 != 0; lVar2 = lVar2 + -1) {
      pOVar6->m_xform[0][0] = pOVar4->m_xform[0][0];
      pOVar4 = (ON_Xform *)((long)pOVar4 + ((ulong)bVar7 * -2 + 1) * 8);
      pOVar6 = (ON_Xform *)((long)pOVar6 + ((ulong)bVar7 * -2 + 1) * 8);
    }
    t0.m_xform[0][3] = t1.m_xform[0][0];
    t0.m_xform[1][3] = t1.m_xform[0][1];
    t0.m_xform[2][3] = t1.m_xform[0][2];
    pOVar4 = &IdentityTransformation;
    pOVar6 = &t1;
    for (; lVar1 != 0; lVar1 = lVar1 + -1) {
      pOVar6->m_xform[0][0] = pOVar4->m_xform[0][0];
      pOVar4 = (ON_Xform *)((long)pOVar4 + ((ulong)bVar7 * -2 + 1) * 8);
      pOVar6 = (ON_Xform *)((long)pOVar6 + ((ulong)bVar7 * -2 + 1) * 8);
    }
    t1.m_xform[0][3] = delta.x;
    t1.m_xform[1][3] = delta.y;
    t1.m_xform[2][3] = delta.z;
    operator*(&local_118,&t1,&s);
    operator*(__return_storage_ptr__,&local_118,&t0);
  }
  else {
    pdVar3 = (double *)&s;
    pdVar5 = (double *)__return_storage_ptr__;
    for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
      *pdVar5 = *pdVar3;
      pdVar3 = pdVar3 + 1;
      pdVar5 = pdVar5 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_Xform ON_Xform::ScaleTransformation(
  const ON_3dPoint& fixed_point,
  double x_scale_factor,
  double y_scale_factor,
  double z_scale_factor
)
{
  const ON_Xform s(ON_Xform::DiagonalTransformation(x_scale_factor, y_scale_factor, z_scale_factor));
  if ( fixed_point.x == 0.0 && fixed_point.y == 0.0 && fixed_point.z == 0.0 )
  {
    return s;
  }

  const ON_3dVector delta = fixed_point - ON_3dPoint::Origin;
  ON_Xform t0(ON_Xform::TranslationTransformation(-delta));
  ON_Xform t1(ON_Xform::TranslationTransformation(delta));
  return (t1*s*t0);
}